

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O1

void duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
     Execute<duckdb::timestamp_t,double,duckdb::ArgMinMaxState<duckdb::timestamp_t,double>>
               (ArgMinMaxState<duckdb::timestamp_t,_double> *state,timestamp_t x_data,double y_data,
               AggregateBinaryInput *binary)

{
  unsigned_long *puVar1;
  bool bVar2;
  BY_TYPE_conflict1 local_28;
  
  puVar1 = (binary->right_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if ((puVar1 != (unsigned_long *)0x0) &&
     ((puVar1[binary->ridx >> 6] >> (binary->ridx & 0x3f) & 1) == 0)) {
    return;
  }
  local_28 = y_data;
  bVar2 = GreaterThan::Operation<double>(&state->value,&local_28);
  if (!bVar2) {
    return;
  }
  puVar1 = (binary->left_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0) {
    (state->super_ArgMinMaxStateBase).arg_null = false;
  }
  else {
    bVar2 = (puVar1[binary->lidx >> 6] >> (binary->lidx & 0x3f) & 1) == 0;
    (state->super_ArgMinMaxStateBase).arg_null = bVar2;
    if (bVar2) goto LAB_019d714b;
  }
  (state->arg).value = x_data.value;
LAB_019d714b:
  state->value = local_28;
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}